

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool ON_String::EqualOrdinal
               (char *string1,int element_count1,char *string2,int element_count2,
               bool bOrdinalIgnoreCase)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int local_44;
  uint c2;
  uint c1;
  int i;
  int element_count;
  char null_terminator;
  bool bOrdinalIgnoreCase_local;
  char *pcStack_28;
  int element_count2_local;
  char *string2_local;
  char *pcStack_18;
  int element_count1_local;
  char *string1_local;
  
  if (((string1 == (char *)0x0) && (element_count1 != 0)) ||
     ((string2 == (char *)0x0 && (element_count2 != 0)))) {
    if (string1 == string2) {
      return true;
    }
    if (string1 == (char *)0x0) {
      return false;
    }
    if (string2 == (char *)0x0) {
      return false;
    }
  }
  i._2_1_ = 0;
  i._3_1_ = bOrdinalIgnoreCase;
  element_count = element_count2;
  pcStack_28 = string2;
  string2_local._4_4_ = element_count1;
  pcStack_18 = string1;
  if (element_count1 < 0) {
    string2_local._4_4_ = Length(string1);
  }
  if (element_count < 0) {
    element_count = Length(pcStack_28);
  }
  if (string2_local._4_4_ == 0) {
    pcStack_18 = (char *)((long)&i + 2);
  }
  if (element_count == 0) {
    pcStack_28 = (char *)((long)&i + 2);
  }
  if ((pcStack_18 != pcStack_28) || (string2_local._4_4_ != element_count)) {
    if (element_count < string2_local._4_4_) {
      local_44 = element_count;
    }
    else {
      local_44 = string2_local._4_4_;
    }
    if ((i._3_1_ & 1) == 0) {
      for (c2 = 0; (int)c2 < local_44; c2 = c2 + 1) {
        if (*pcStack_18 != *pcStack_28) {
          return false;
        }
        pcStack_28 = pcStack_28 + 1;
        pcStack_18 = pcStack_18 + 1;
      }
    }
    else {
      for (c2 = 0; (int)c2 < local_44; c2 = c2 + 1) {
        cVar1 = *pcStack_18;
        pcStack_18 = pcStack_18 + 1;
        uVar2 = OrdinalUTF8ToIgnoreCase(cVar1);
        cVar1 = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
        uVar3 = OrdinalUTF8ToIgnoreCase(cVar1);
        if (uVar2 != uVar3) {
          return false;
        }
      }
    }
    for (; (int)c2 < string2_local._4_4_; c2 = c2 + 1) {
      if (*pcStack_18 != '\0') {
        return false;
      }
      pcStack_18 = pcStack_18 + 1;
    }
    for (; (int)c2 < element_count; c2 = c2 + 1) {
      if (*pcStack_28 != '\0') {
        return false;
      }
      pcStack_28 = pcStack_28 + 1;
    }
  }
  return true;
}

Assistant:

bool ON_String::EqualOrdinal(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(string1,element_count1,string2,element_count2);

  const int element_count = (element_count1 <= element_count2) ? element_count1 : element_count2;
  int i;
  if (bOrdinalIgnoreCase)
  {
    unsigned int c1, c2;
    for(i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i = 0; i < element_count; i++)
    {
      if ((*string1++) != (*string2++))
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return false;
  }

  return true;
}